

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 sqlite3VdbeIntValue(Mem *pMem)

{
  ushort uVar1;
  i64 iVar2;
  i64 iStack_10;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 0x24) != 0) {
    return (i64)(pMem->u).r;
  }
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x12) == 0) {
      return 0;
    }
    iStack_10 = 0;
    sqlite3Atoi64(pMem->z,&iStack_10,pMem->n,pMem->enc);
    return iStack_10;
  }
  iVar2 = doubleToInt64((pMem->u).r);
  return iVar2;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3VdbeIntValue(Mem *pMem){
  int flags;
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  flags = pMem->flags;
  if( flags & (MEM_Int|MEM_IntReal) ){
    testcase( flags & MEM_IntReal );
    return pMem->u.i;
  }else if( flags & MEM_Real ){
    return doubleToInt64(pMem->u.r);
  }else if( flags & (MEM_Str|MEM_Blob) ){
    assert( pMem->z || pMem->n==0 );
    return memIntValue(pMem);
  }else{
    return 0;
  }
}